

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * cmCTest::DecodeURL(string *__return_storage_ptr__,string *in)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ulong in_RAX;
  char *pcVar4;
  undefined5 uStack_38;
  char buf [3];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar4 = (in->_M_dataplus)._M_p;
  _uStack_38 = in_RAX;
  do {
    if (*pcVar4 == '%') {
      cVar1 = pcVar4[1];
      iVar3 = isxdigit((int)cVar1);
      if (iVar3 == 0) goto LAB_0016c08b;
      cVar2 = pcVar4[2];
      iVar3 = isxdigit((int)cVar2);
      if (iVar3 == 0) goto LAB_0016c08b;
      _uStack_38 = (ulong)CONCAT16(cVar2,CONCAT15(cVar1,uStack_38));
      strtoul(buf,(char **)0x0,0x10);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
      pcVar4 = pcVar4 + 2;
    }
    else {
      if (*pcVar4 == '\0') {
        return __return_storage_ptr__;
      }
LAB_0016c08b:
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string cmCTest::DecodeURL(const std::string& in)
{
  std::string out;
  for (const char* c = in.c_str(); *c; ++c) {
    if (*c == '%' && isxdigit(*(c + 1)) && isxdigit(*(c + 2))) {
      char buf[3] = { *(c + 1), *(c + 2), 0 };
      out.append(1, static_cast<char>(strtoul(buf, nullptr, 16)));
      c += 2;
    } else {
      out.append(1, *c);
    }
  }
  return out;
}